

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry-inl.h
# Opt level: O2

void __thiscall
spdlog::details::registry::set_tp(registry *this,shared_ptr<spdlog::details::thread_pool> *tp)

{
  std::recursive_mutex::lock(&this->tp_mutex_);
  std::__shared_ptr<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->tp_).
              super___shared_ptr<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2>,
             &tp->super___shared_ptr<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2>);
  pthread_mutex_unlock((pthread_mutex_t *)&this->tp_mutex_);
  return;
}

Assistant:

SPDLOG_INLINE void registry::set_tp(std::shared_ptr<thread_pool> tp) {
    std::lock_guard<std::recursive_mutex> lock(tp_mutex_);
    tp_ = std::move(tp);
}